

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

int Abc_NtkDarProve(Abc_Ntk_t *pNtk,Fra_Sec_t *pSecPar,int nBmcFramesMax,int nBmcConfMax)

{
  Abc_Cex_t *pAVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  Aig_Man_t *pAig;
  long lVar5;
  long lVar6;
  char *format;
  int iVar7;
  Abc_Ntk_t *pAVar8;
  Aig_Man_t *pAVar9;
  Abc_Cex_t *__ptr;
  timespec local_a8;
  int iFrame;
  Abc_Ntk_t *pNtkComb;
  timespec ts;
  
  iFrame = -1;
  iVar3 = 3;
  iVar2 = clock_gettime(3,(timespec *)&ts);
  if (iVar2 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec) / 1000 + ts.tv_sec * 1000000;
  }
  if (pSecPar->fTryComb == 0) {
    if (pNtk->nObjCounts[8] != 0) goto LAB_002ab390;
LAB_002ab2ef:
    Abc_Print(iVar3,"The network has no latches. Running CEC.\n");
  }
  else if (pNtk->nObjCounts[8] == 0) goto LAB_002ab2ef;
  pNtkComb = Abc_NtkDup(pNtk);
  Abc_NtkMakeComb(pNtkComb,1);
  Prove_ParamsSetDefault((Prove_Params_t *)&ts);
  ts.tv_nsec._4_4_ = 1;
  iVar2 = Abc_NtkIvyProve(&pNtkComb,(Prove_Params_t *)&ts);
  pAVar8 = pNtkComb;
  if (iVar2 == 0) {
    if (pNtk->nObjCounts[8] == 0) {
      pNtk->pModel = pNtkComb->pModel;
      pNtkComb->pModel = (int *)0x0;
      iVar7 = pSecPar->fReportSolution;
      pcVar4 = "SATISFIABLE    ";
      format = "SOLUTION: FAIL       ";
      goto LAB_002ab468;
    }
    Abc_NtkDelete(pNtkComb);
    iVar3 = (int)pAVar8;
  }
  else {
    Abc_NtkDelete(pNtkComb);
    iVar3 = (int)pAVar8;
    if (iVar2 == 1) {
      iVar7 = pSecPar->fReportSolution;
      pcVar4 = "UNSATISFIABLE  ";
      format = "SOLUTION: PASS       ";
LAB_002ab468:
      iVar3 = (int)pAVar8;
      if (iVar7 == 0) {
        format = pcVar4;
      }
      goto LAB_002ab46c;
    }
  }
  if (pNtk->nObjCounts[8] != 0) {
LAB_002ab390:
    pAVar8 = pNtk;
    pAig = Abc_NtkToDar(pNtk,0,1);
    if (pAig == (Aig_Man_t *)0x0) {
      Abc_Print((int)pAVar8,"Converting miter into AIG has failed.\n");
      return -1;
    }
    if (0 < pAig->nRegs) {
      if (pSecPar->fTryBmc != 0) {
        pAVar9 = pAig;
        iVar2 = Saig_BmcPerform(pAig,0,nBmcFramesMax,2000,0,nBmcConfMax,0,pSecPar->fVerbose,0,
                                &iFrame,0,0);
        iVar3 = (int)pAVar9;
        if (iVar2 == 0) {
          Abc_Print(iVar3,"Networks are not equivalent.\n");
          if (pSecPar->fReportSolution != 0) {
            Abc_Print(iVar3,"SOLUTION: FAIL       ");
            Abc_Print(iVar3,"%s =","Time");
            iVar3 = 3;
            iVar2 = clock_gettime(3,(timespec *)&ts);
            if (iVar2 < 0) {
              lVar5 = -1;
            }
            else {
              lVar5 = CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec) / 1000 + ts.tv_sec * 1000000
              ;
            }
            Abc_Print(iVar3,"%9.2f sec\n",(double)(lVar5 - lVar6) / 1000000.0);
          }
          if (pNtk->pModel != (int *)0x0) {
            free(pNtk->pModel);
            pNtk->pModel = (int *)0x0;
          }
          if (pNtk->pSeqModel != (Abc_Cex_t *)0x0) {
            free(pNtk->pSeqModel);
          }
          pNtk->pSeqModel = pAig->pSeqModel;
          pAig->pSeqModel = (Abc_Cex_t *)0x0;
          Aig_ManStop(pAig);
          return 0;
        }
      }
      if (pSecPar->fUseNewProver == 0) {
        iVar2 = Fra_FraigSec(pAig,pSecPar,(Aig_Man_t **)0x0);
        if (pNtk->pModel != (int *)0x0) {
          free(pNtk->pModel);
          pNtk->pModel = (int *)0x0;
        }
        __ptr = pNtk->pSeqModel;
        if (__ptr != (Abc_Cex_t *)0x0) {
          free(__ptr);
        }
        pAVar1 = pAig->pSeqModel;
        pNtk->pSeqModel = pAVar1;
        pAig->pSeqModel = (Abc_Cex_t *)0x0;
        if (pAVar1 != (Abc_Cex_t *)0x0) {
          Abc_Print((int)__ptr,"Output %d of miter \"%s\" was asserted in frame %d.\n",
                    (ulong)(uint)pAVar1->iPo,pNtk->pName,(ulong)(uint)pAVar1->iFrame);
          pAVar9 = pAig;
          iVar3 = Saig_ManVerifyCex(pAig,pNtk->pSeqModel);
          if (iVar3 == 0) {
            Abc_Print((int)pAVar9,"Abc_NtkDarProve(): Counter-example verification has FAILED.\n");
          }
        }
      }
      else {
        iVar2 = Ssw_SecGeneralMiter(pAig,(Ssw_Pars_t *)0x0);
      }
      Aig_ManStop(pAig);
      return iVar2;
    }
    __assert_fail("pMan->nRegs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                  ,0xb4b,"int Abc_NtkDarProve(Abc_Ntk_t *, Fra_Sec_t *, int, int)");
  }
  format = "UNDECIDED      ";
LAB_002ab46c:
  Abc_Print(iVar3,format);
  Abc_Print(iVar3,"%s =","Time");
  iVar7 = 3;
  iVar3 = clock_gettime(3,&local_a8);
  if (iVar3 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
  }
  Abc_Print(iVar7,"%9.2f sec\n",(double)(lVar5 - lVar6) / 1000000.0);
  return iVar2;
}

Assistant:

int Abc_NtkDarProve( Abc_Ntk_t * pNtk, Fra_Sec_t * pSecPar, int nBmcFramesMax, int nBmcConfMax )
{
    Aig_Man_t * pMan;
    int iFrame = -1, RetValue = -1;
    abctime clkTotal = Abc_Clock();
    if ( pSecPar->fTryComb || Abc_NtkLatchNum(pNtk) == 0 )
    {
        Prove_Params_t Params, * pParams = &Params;
        Abc_Ntk_t * pNtkComb;
        int RetValue;
        if ( Abc_NtkLatchNum(pNtk) == 0 )
            Abc_Print( 1, "The network has no latches. Running CEC.\n" );
        // create combinational network
        pNtkComb = Abc_NtkDup( pNtk );
        Abc_NtkMakeComb( pNtkComb, 1 );
        // solve it using combinational equivalence checking
        Prove_ParamsSetDefault( pParams );
        pParams->fVerbose = 1;
        RetValue = Abc_NtkIvyProve( &pNtkComb, pParams );
        // transfer model if given
//        pNtk->pModel = pNtkComb->pModel; pNtkComb->pModel = NULL;
        if ( RetValue == 0  && (Abc_NtkLatchNum(pNtk) == 0) )
        {
            pNtk->pModel = pNtkComb->pModel; pNtkComb->pModel = NULL;
            if ( pSecPar->fReportSolution )
                Abc_Print( 1, "SOLUTION: FAIL       " );
            else
                Abc_Print( 1, "SATISFIABLE    " );
            ABC_PRT( "Time", Abc_Clock() - clkTotal );
            return RetValue;
        }
        Abc_NtkDelete( pNtkComb );
        // return the result, if solved
        if ( RetValue == 1 )
        {
            if ( pSecPar->fReportSolution )
                Abc_Print( 1, "SOLUTION: PASS       " );
            else
                Abc_Print( 1, "UNSATISFIABLE  " );
            ABC_PRT( "Time", Abc_Clock() - clkTotal );
            return RetValue;
        }
        // return undecided, if the miter is combinational
        if ( Abc_NtkLatchNum(pNtk) == 0 )
        {
            Abc_Print( 1, "UNDECIDED      " );
            ABC_PRT( "Time", Abc_Clock() - clkTotal );
            return RetValue;
        }
    }
    // derive the AIG manager
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
    {
        Abc_Print( 1, "Converting miter into AIG has failed.\n" );
        return -1;
    }
    assert( pMan->nRegs > 0 );

    if ( pSecPar->fTryBmc )
    {
        RetValue = Saig_BmcPerform( pMan, 0, nBmcFramesMax, 2000, 0, nBmcConfMax, 0, pSecPar->fVerbose, 0, &iFrame, 0, 0 );
        if ( RetValue == 0 )
        {
            Abc_Print( 1, "Networks are not equivalent.\n" );
            if ( pSecPar->fReportSolution )
            {
                Abc_Print( 1, "SOLUTION: FAIL       " );
                ABC_PRT( "Time", Abc_Clock() - clkTotal );
            }
            // return the counter-example generated
            ABC_FREE( pNtk->pModel );
            ABC_FREE( pNtk->pSeqModel );
            pNtk->pSeqModel = pMan->pSeqModel; pMan->pSeqModel = NULL;
            Aig_ManStop( pMan );
            return RetValue;
        }
    } 
    // perform verification
    if ( pSecPar->fUseNewProver )
    {
        RetValue = Ssw_SecGeneralMiter( pMan, NULL );
    }
    else
    {
        RetValue = Fra_FraigSec( pMan, pSecPar, NULL );
        ABC_FREE( pNtk->pModel );
        ABC_FREE( pNtk->pSeqModel );
        pNtk->pSeqModel = pMan->pSeqModel; pMan->pSeqModel = NULL;
        if ( pNtk->pSeqModel )
        {
            Abc_Cex_t * pCex = pNtk->pSeqModel;
            Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.\n", pCex->iPo, pNtk->pName, pCex->iFrame );
            if ( !Saig_ManVerifyCex( pMan, pNtk->pSeqModel ) )
                Abc_Print( 1, "Abc_NtkDarProve(): Counter-example verification has FAILED.\n" );
        }
    }
    Aig_ManStop( pMan );
    return RetValue;
}